

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecompress2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                 int pitch,int height,int pixelFormat,int flags)

{
  int iVar1;
  char *pcVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  j_decompress_ptr in_RDI;
  JDIMENSION in_R8D;
  int in_R9D;
  j_decompress_ptr dinfo;
  tjinstance *this;
  my_progress_mgr progress;
  int scaledh;
  int scaledw;
  int jpegheight;
  int jpegwidth;
  int retval;
  int i;
  JSAMPROW *row_pointer;
  j_decompress_ptr cinfo;
  code *in_stack_ffffffffffffff88;
  j_decompress_ptr in_stack_ffffffffffffff90;
  int local_40;
  int local_3c;
  void *local_38;
  int local_30;
  JDIMENSION local_2c;
  int local_4;
  
  local_38 = (void *)0x0;
  local_40 = 0;
  if (in_RDI == (j_decompress_ptr)0x0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"Invalid handle");
    local_4 = -1;
  }
  else {
    cinfo = (j_decompress_ptr)(in_RDI->MCU_membership + 9);
    *(undefined4 *)in_RDI[2].ac_huff_tbl_ptrs = 0;
    in_RDI[2].blocks_in_MCU = 0;
    *(uint *)((long)in_RDI[2].ac_huff_tbl_ptrs + 4) =
         (uint)(((uint)progress.pub.pass_counter & 0x2000) != 0);
    if (((ulong)in_RDI[2].ac_huff_tbl_ptrs[1] & 2) == 0) {
      snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s",
               "tjDecompress2(): Instance has not been initialized for decompression");
      in_RDI[2].blocks_in_MCU = 1;
      pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar2,200,"%s",
               "tjDecompress2(): Instance has not been initialized for decompression");
      local_40 = -1;
    }
    else if (((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == 0)) ||
             (((int)in_R8D < 0 || (in_R9D < 0)))) ||
            (((int)(JDIMENSION)this < 0 ||
             (((int)progress.pub.progress_monitor < 0 || (0xb < (int)progress.pub.progress_monitor))
             )))) {
      snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s","tjDecompress2(): Invalid argument"
              );
      in_RDI[2].blocks_in_MCU = 1;
      pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar2,200,"%s","tjDecompress2(): Invalid argument");
      local_40 = -1;
    }
    else {
      if (((uint)progress.pub.pass_counter & 8) == 0) {
        if (((uint)progress.pub.pass_counter & 0x10) == 0) {
          if (((uint)progress.pub.pass_counter & 0x20) != 0) {
            putenv("JSIMD_FORCESSE2=1");
          }
        }
        else {
          putenv("JSIMD_FORCESSE=1");
        }
      }
      else {
        putenv("JSIMD_FORCEMMX=1");
      }
      if (((uint)progress.pub.pass_counter & 0x8000) == 0) {
        cinfo->progress = (jpeg_progress_mgr *)0x0;
      }
      else {
        memset(&stack0xffffffffffffff88,0,0x28);
        in_stack_ffffffffffffff88 = my_progress_monitor;
        cinfo->progress = (jpeg_progress_mgr *)&stack0xffffffffffffff88;
      }
      iVar1 = _setjmp((__jmp_buf_tag *)&in_RDI[2].num_components);
      if (iVar1 == 0) {
        jpeg_mem_src_tj(in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88,
                        (unsigned_long)in_RDI);
        jpeg_read_header(in_RDI,(boolean)((ulong)cinfo >> 0x20));
        *(J_COLOR_SPACE *)&in_RDI->marker = pf2cs[(int)progress.pub.progress_monitor];
        if (((uint)progress.pub.pass_counter & 0x800) != 0) {
          *(undefined4 *)&in_RDI->cconvert = 1;
        }
        if (((uint)progress.pub.pass_counter & 0x100) != 0) {
          cinfo->do_fancy_upsampling = 0;
        }
        local_2c = in_R8D;
        if (in_R8D == 0) {
          local_2c = cinfo->image_width;
        }
        if ((JDIMENSION)this == 0) {
          this._0_4_ = cinfo->image_height;
        }
        local_3c = 0;
        while ((local_3c < 0x10 &&
               (((int)local_2c <
                 (int)(cinfo->image_width * sf[local_3c].num + sf[local_3c].denom + -1) /
                 sf[local_3c].denom ||
                ((int)(JDIMENSION)this <
                 (int)(cinfo->image_height * sf[local_3c].num + sf[local_3c].denom + -1) /
                 sf[local_3c].denom))))) {
          local_3c = local_3c + 1;
        }
        if (local_3c < 0x10) {
          cinfo->scale_num = sf[local_3c].num;
          cinfo->scale_denom = sf[local_3c].denom;
          jpeg_start_decompress(cinfo);
          local_30 = in_R9D;
          if (in_R9D == 0) {
            local_30 = cinfo->output_width * tjPixelSize[(int)progress.pub.progress_monitor];
          }
          local_38 = malloc((ulong)cinfo->output_height << 3);
          if (local_38 == (void *)0x0) {
            snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s",
                     "tjDecompress2(): Memory allocation failure");
            in_RDI[2].blocks_in_MCU = 1;
            pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
            snprintf(pcVar2,200,"%s","tjDecompress2(): Memory allocation failure");
            local_40 = -1;
          }
          else {
            iVar1 = _setjmp((__jmp_buf_tag *)&in_RDI[2].num_components);
            if (iVar1 == 0) {
              for (local_3c = 0; local_3c < (int)cinfo->output_height; local_3c = local_3c + 1) {
                if (((uint)progress.pub.pass_counter & 2) == 0) {
                  *(long *)((long)local_38 + (long)local_3c * 8) =
                       in_RCX + (long)local_3c * (long)local_30;
                }
                else {
                  *(ulong *)((long)local_38 + (long)local_3c * 8) =
                       in_RCX + (ulong)((cinfo->output_height - local_3c) - 1) * (long)local_30;
                }
              }
              while (cinfo->output_scanline < cinfo->output_height) {
                jpeg_read_scanlines((j_decompress_ptr)in_stack_ffffffffffffff88,(JSAMPARRAY)in_RDI,
                                    (JDIMENSION)((ulong)cinfo >> 0x20));
              }
              jpeg_finish_decompress(cinfo);
            }
            else {
              local_40 = -1;
            }
          }
        }
        else {
          snprintf((char *)(in_RDI[2].ac_huff_tbl_ptrs + 2),200,"%s",
                   "tjDecompress2(): Could not scale down to desired image dimensions");
          in_RDI[2].blocks_in_MCU = 1;
          pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
          snprintf(pcVar2,200,"%s",
                   "tjDecompress2(): Could not scale down to desired image dimensions");
          local_40 = -1;
        }
      }
      else {
        local_40 = -1;
      }
    }
    if (200 < cinfo->global_state) {
      jpeg_abort_decompress((j_decompress_ptr)0x17c7ef);
    }
    free(local_38);
    if (*(int *)in_RDI[2].ac_huff_tbl_ptrs != 0) {
      local_40 = -1;
    }
    *(undefined4 *)((long)in_RDI[2].ac_huff_tbl_ptrs + 4) = 0;
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjDecompress2(tjhandle handle, const unsigned char *jpegBuf,
                            unsigned long jpegSize, unsigned char *dstBuf,
                            int width, int pitch, int height, int pixelFormat,
                            int flags)
{
  JSAMPROW *row_pointer = NULL;
  int i, retval = 0, jpegwidth, jpegheight, scaledw, scaledh;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompress2(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pitch < 0 || height < 0 || pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecompress2(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompress2(): Could not scale down to desired image dimensions");
  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;

  jpeg_start_decompress(dinfo);
  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer =
       (JSAMPROW *)malloc(sizeof(JSAMPROW) * dinfo->output_height)) == NULL)
    THROW("tjDecompress2(): Memory allocation failure");
  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }
  for (i = 0; i < (int)dinfo->output_height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(dinfo->output_height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  while (dinfo->output_scanline < dinfo->output_height)
    jpeg_read_scanlines(dinfo, &row_pointer[dinfo->output_scanline],
                        dinfo->output_height - dinfo->output_scanline);
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}